

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O0

base_learner * oaa_setup(options_i *options,vw *all)

{
  uint64_t uVar1;
  uint32_t uVar2;
  vw *pvVar3;
  byte bVar4;
  bool bVar5;
  uint32_t uVar6;
  pointer poVar7;
  ostream *poVar8;
  undefined8 uVar9;
  polyprediction *ppVar10;
  uint *puVar11;
  ulong uVar12;
  vw *in_RSI;
  long *in_RDI;
  float fVar13;
  string loss_function_type;
  single_learner *base;
  learner<oaa,_example> *l;
  oaa *data_ptr;
  uint32_t tmp;
  size_t j;
  size_t i_1;
  size_t i;
  stringstream __msg;
  option_group_definition new_options;
  bool scores;
  bool probabilities;
  free_ptr<oaa> data;
  undefined4 in_stack_fffffffffffff518;
  undefined4 in_stack_fffffffffffff51c;
  vw *in_stack_fffffffffffff520;
  string *in_stack_fffffffffffff528;
  _func_void_oaa_ptr_learner<char,_example>_ptr_example_ptr *predict;
  single_learner *in_stack_fffffffffffff530;
  single_learner *learn;
  parser *in_stack_fffffffffffff538;
  learner<oaa,_example> *in_stack_fffffffffffff540;
  int plineNumber;
  char *in_stack_fffffffffffff548;
  prediction_type_t pred_type;
  vw_exception *in_stack_fffffffffffff550;
  typed_option<bool> *in_stack_fffffffffffff568;
  option_group_definition *in_stack_fffffffffffff570;
  float local_a28;
  allocator *l_00;
  allocator *nmemb;
  string local_910 [32];
  single_learner *local_8f0;
  learner<oaa,_example> *local_8e8;
  pointer local_8e0;
  uint32_t local_8d4;
  long local_8d0;
  ulong local_8c8;
  ulong local_8c0;
  undefined1 local_8b1;
  stringstream local_890 [16];
  ostream local_880;
  undefined4 local_708;
  allocator local_701;
  string local_700 [39];
  allocator local_6d9;
  string local_6d8 [39];
  allocator local_6b1;
  string local_6b0 [359];
  allocator local_549;
  string local_548 [39];
  allocator local_521;
  string local_520 [359];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [359];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  typed_option<unsigned_long> local_1e0 [2];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [62];
  byte local_2a;
  byte local_29;
  undefined1 local_28 [16];
  vw *local_18;
  long *local_10;
  vw *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<oaa>();
  local_29 = 0;
  local_2a = 0;
  nmemb = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"One Against All Options",nmemb);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff520,
             (string *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  l_00 = &local_201;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"oaa",l_00);
  std::unique_ptr<oaa,_void_(*)(void_*)>::operator->((unique_ptr<oaa,_void_(*)(void_*)> *)0x363298);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff528,(unsigned_long *)in_stack_fffffffffffff520);
  VW::config::typed_option<unsigned_long>::keep(local_1e0,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"One-against-all multiclass with <k> labels",&local_229);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff520,
             (string *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff520,
             (typed_option<unsigned_long> *)
             CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_fffffffffffff570,(typed_option<unsigned_long> *)in_stack_fffffffffffff568);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"oaa_subsample",&local_391);
  std::unique_ptr<oaa,_void_(*)(void_*)>::operator->((unique_ptr<oaa,_void_(*)(void_*)> *)0x363396);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff528,(unsigned_long *)in_stack_fffffffffffff520);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3b8,"subsample this number of negative examples when learning",&local_3b9);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff520,
             (string *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff520,
             (typed_option<unsigned_long> *)
             CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_fffffffffffff570,(typed_option<unsigned_long> *)in_stack_fffffffffffff568);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_520,"probabilities",&local_521);
  VW::config::make_option<bool>(in_stack_fffffffffffff528,(bool *)in_stack_fffffffffffff520);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"predict probabilites of all classes",&local_549);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff520,
             (string *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff520,
             (typed_option<bool> *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6b0,"scores",&local_6b1);
  VW::config::make_option<bool>(in_stack_fffffffffffff528,(bool *)in_stack_fffffffffffff520);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d8,"output raw scores per class",&local_6d9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff520,
             (string *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff520,
             (typed_option<bool> *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff520);
  std::__cxx11::string::~string(local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff520);
  std::__cxx11::string::~string(local_6b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff520);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff520);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff520);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff520);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff520);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff520);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  (**(code **)*local_10)(local_10,local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_700,"oaa",&local_701);
  bVar4 = (**(code **)(*local_10 + 8))(local_10,local_700);
  std::__cxx11::string::~string(local_700);
  std::allocator<char>::~allocator((allocator<char> *)&local_701);
  if (((bVar4 ^ 0xff) & 1) == 0) {
    learn = in_stack_fffffffffffff530;
    if (local_18->sd->ldict != (namedlabels *)0x0) {
      poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                         ((unique_ptr<oaa,_void_(*)(void_*)> *)0x363bff);
      uVar1 = poVar7->k;
      uVar6 = namedlabels::getK(local_18->sd->ldict);
      learn = in_stack_fffffffffffff530;
      if (uVar1 != uVar6) {
        std::__cxx11::stringstream::stringstream(local_890);
        plineNumber = (int)((ulong)in_stack_fffffffffffff540 >> 0x20);
        poVar8 = std::operator<<(&local_880,"error: you have ");
        uVar6 = namedlabels::getK(local_18->sd->ldict);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar6);
        std::operator<<(poVar8," named labels; use that as the argument to oaa");
        local_8b1 = 1;
        uVar9 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (in_stack_fffffffffffff550,in_stack_fffffffffffff548,plineNumber,
                   (string *)in_stack_fffffffffffff538);
        local_8b1 = 0;
        __cxa_throw(uVar9,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
    }
    pvVar3 = local_18;
    poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                       ((unique_ptr<oaa,_void_(*)(void_*)> *)0x363dda);
    poVar7->all = pvVar3;
    std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
              ((unique_ptr<oaa,_void_(*)(void_*)> *)0x363df3);
    ppVar10 = calloc_or_throw<polyprediction>((size_t)nmemb);
    poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                       ((unique_ptr<oaa,_void_(*)(void_*)> *)0x363e12);
    poVar7->pred = ppVar10;
    poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                       ((unique_ptr<oaa,_void_(*)(void_*)> *)0x363e2b);
    poVar7->subsample_order = (uint32_t *)0x0;
    poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                       ((unique_ptr<oaa,_void_(*)(void_*)> *)0x363e40);
    poVar7->subsample_id = 0;
    poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                       ((unique_ptr<oaa,_void_(*)(void_*)> *)0x363e55);
    pred_type = (prediction_type_t)in_stack_fffffffffffff550;
    if (poVar7->num_subsample != 0) {
      poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                         ((unique_ptr<oaa,_void_(*)(void_*)> *)0x363e6d);
      uVar12 = poVar7->num_subsample;
      poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                         ((unique_ptr<oaa,_void_(*)(void_*)> *)0x363e86);
      pred_type = (prediction_type_t)in_stack_fffffffffffff550;
      if (uVar12 < poVar7->k) {
        std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                  ((unique_ptr<oaa,_void_(*)(void_*)> *)0x363ef8);
        puVar11 = calloc_or_throw<unsigned_int>((size_t)nmemb);
        poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                           ((unique_ptr<oaa,_void_(*)(void_*)> *)0x363f17);
        poVar7->subsample_order = puVar11;
        for (local_8c0 = 0; uVar12 = local_8c0,
            poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                               ((unique_ptr<oaa,_void_(*)(void_*)> *)0x363f4c), uVar12 < poVar7->k;
            local_8c0 = local_8c0 + 1) {
          uVar6 = (uint32_t)local_8c0;
          poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                             ((unique_ptr<oaa,_void_(*)(void_*)> *)0x363f78);
          poVar7->subsample_order[local_8c0] = uVar6;
        }
        local_8c8 = 0;
        while( true ) {
          uVar12 = local_8c8;
          poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                             ((unique_ptr<oaa,_void_(*)(void_*)> *)0x363fcd);
          pred_type = (prediction_type_t)in_stack_fffffffffffff550;
          if (poVar7->k <= uVar12) break;
          fVar13 = merand48((uint64_t *)in_stack_fffffffffffff520);
          poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                             ((unique_ptr<oaa,_void_(*)(void_*)> *)0x36400d);
          local_a28 = (float)(poVar7->k - local_8c8);
          uVar12 = (ulong)(fVar13 * local_a28);
          local_8d0 = (uVar12 | (long)(fVar13 * local_a28 - 9.223372e+18) & (long)uVar12 >> 0x3f) +
                      local_8c8;
          poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                             ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3640b9);
          local_8d4 = poVar7->subsample_order[local_8c8];
          poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                             ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3640dc);
          uVar6 = poVar7->subsample_order[local_8d0];
          poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                             ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3640ff);
          uVar2 = local_8d4;
          poVar7->subsample_order[local_8c8] = uVar6;
          poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                             ((unique_ptr<oaa,_void_(*)(void_*)> *)0x364130);
          poVar7->subsample_order[local_8d0] = uVar2;
          local_8c8 = local_8c8 + 1;
        }
      }
      else {
        poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                           ((unique_ptr<oaa,_void_(*)(void_*)> *)0x363ea3);
        poVar7->num_subsample = 0;
        poVar8 = std::operator<<(&(local_18->trace_message).super_ostream,
                                 "oaa is turning off subsampling because your parameter >= K");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      }
    }
    local_8e0 = std::unique_ptr<oaa,_void_(*)(void_*)>::get
                          ((unique_ptr<oaa,_void_(*)(void_*)> *)in_stack_fffffffffffff520);
    setup_base((options_i *)in_stack_fffffffffffff528,in_stack_fffffffffffff520);
    in_stack_fffffffffffff530 = LEARNER::as_singleline<char,char>((learner<char,_char> *)l_00);
    local_8f0 = in_stack_fffffffffffff530;
    if (((local_29 & 1) == 0) && ((local_2a & 1) == 0)) {
      if (local_18->raw_prediction < 1) {
        in_stack_fffffffffffff538 = local_18->p;
        predict = (_func_void_oaa_ptr_learner<char,_example>_ptr_example_ptr *)local_28;
        std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                  ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3644a4);
        in_stack_fffffffffffff540 =
             LEARNER::init_multiclass_learner<oaa,example,LEARNER::learner<char,example>>
                       ((free_ptr<oaa> *)in_stack_fffffffffffff540,
                        (learner<char,_example> *)in_stack_fffffffffffff538,
                        (_func_void_oaa_ptr_learner<char,_example>_ptr_example_ptr *)
                        in_stack_fffffffffffff530,predict,(parser *)in_stack_fffffffffffff520,
                        CONCAT44(in_stack_fffffffffffff51c,4),pred_type);
        local_8e8 = in_stack_fffffffffffff540;
      }
      else {
        std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                  ((unique_ptr<oaa,_void_(*)(void_*)> *)0x364430);
        local_8e8 = LEARNER::init_multiclass_learner<oaa,example,LEARNER::learner<char,example>>
                              ((free_ptr<oaa> *)in_stack_fffffffffffff540,
                               (learner<char,_example> *)in_stack_fffffffffffff538,
                               (_func_void_oaa_ptr_learner<char,_example>_ptr_example_ptr *)learn,
                               (_func_void_oaa_ptr_learner<char,_example>_ptr_example_ptr *)
                               in_stack_fffffffffffff528,(parser *)in_stack_fffffffffffff520,
                               CONCAT44(in_stack_fffffffffffff51c,4),
                               (prediction_type_t)in_stack_fffffffffffff530);
        in_stack_fffffffffffff530 = learn;
      }
    }
    else {
      local_18->delete_prediction = delete_scalars;
      if ((local_29 & 1) == 0) {
        std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                  ((unique_ptr<oaa,_void_(*)(void_*)> *)0x364390);
        local_8e8 = LEARNER::init_multiclass_learner<oaa,example,LEARNER::learner<char,example>>
                              ((free_ptr<oaa> *)in_stack_fffffffffffff540,
                               (learner<char,_example> *)in_stack_fffffffffffff538,
                               (_func_void_oaa_ptr_learner<char,_example>_ptr_example_ptr *)learn,
                               (_func_void_oaa_ptr_learner<char,_example>_ptr_example_ptr *)
                               in_stack_fffffffffffff528,(parser *)in_stack_fffffffffffff520,
                               CONCAT44(in_stack_fffffffffffff51c,1),pred_type);
        LEARNER::learner<oaa,_example>::set_finish_example(local_8e8,finish_example_scores<false>);
        in_stack_fffffffffffff530 = learn;
      }
      else {
        (**local_18->loss->_vptr_loss_function)(local_910);
        bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff520,
                                (char *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518
                                                ));
        if (bVar5) {
          poVar8 = std::operator<<(&(local_18->trace_message).super_ostream,
                                   "WARNING: --probabilities should be used only with --loss_function=logistic"
                                  );
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        }
        std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                  ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3642db);
        local_8e8 = LEARNER::init_multiclass_learner<oaa,example,LEARNER::learner<char,example>>
                              ((free_ptr<oaa> *)in_stack_fffffffffffff540,
                               (learner<char,_example> *)in_stack_fffffffffffff538,
                               (_func_void_oaa_ptr_learner<char,_example>_ptr_example_ptr *)learn,
                               (_func_void_oaa_ptr_learner<char,_example>_ptr_example_ptr *)
                               in_stack_fffffffffffff528,(parser *)in_stack_fffffffffffff520,
                               CONCAT44(in_stack_fffffffffffff51c,1),pred_type);
        local_18->sd->report_multiclass_log_loss = true;
        LEARNER::learner<oaa,_example>::set_finish_example(local_8e8,finish_example_scores<true>);
        std::__cxx11::string::~string(local_910);
        in_stack_fffffffffffff530 = learn;
      }
    }
    if (local_8e0->num_subsample != 0) {
      LEARNER::learner<oaa,example>::set_learn<LEARNER::learner<char,example>>
                ((learner<oaa,example> *)local_8e8,learn_randomized);
    }
    LEARNER::learner<oaa,_example>::set_finish
              (in_stack_fffffffffffff540,(_func_void_oaa_ptr *)in_stack_fffffffffffff538);
    in_stack_fffffffffffff520 = (vw *)LEARNER::make_base<oaa,example>(local_8e8);
    local_8 = in_stack_fffffffffffff520;
  }
  else {
    local_8 = (vw *)0x0;
  }
  local_708 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff520);
  std::unique_ptr<oaa,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<oaa,_void_(*)(void_*)> *)in_stack_fffffffffffff530);
  return (base_learner *)local_8;
}

Assistant:

LEARNER::base_learner* oaa_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<oaa>();
  bool probabilities = false;
  bool scores = false;
  option_group_definition new_options("One Against All Options");
  new_options.add(make_option("oaa", data->k).keep().help("One-against-all multiclass with <k> labels"))
      .add(make_option("oaa_subsample", data->num_subsample)
               .help("subsample this number of negative examples when learning"))
      .add(make_option("probabilities", probabilities).help("predict probabilites of all classes"))
      .add(make_option("scores", scores).help("output raw scores per class"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("oaa"))
    return nullptr;

  if (all.sd->ldict && (data->k != all.sd->ldict->getK()))
    THROW("error: you have " << all.sd->ldict->getK() << " named labels; use that as the argument to oaa")

  data->all = &all;
  data->pred = calloc_or_throw<polyprediction>(data->k);
  data->subsample_order = nullptr;
  data->subsample_id = 0;
  if (data->num_subsample > 0)
  {
    if (data->num_subsample >= data->k)
    {
      data->num_subsample = 0;
      all.trace_message << "oaa is turning off subsampling because your parameter >= K" << endl;
    }
    else
    {
      data->subsample_order = calloc_or_throw<uint32_t>(data->k);
      for (size_t i = 0; i < data->k; i++) data->subsample_order[i] = (uint32_t)i;
      for (size_t i = 0; i < data->k; i++)
      {
        size_t j = (size_t)(merand48(all.random_state) * (float)(data->k - i)) + i;
        uint32_t tmp = data->subsample_order[i];
        data->subsample_order[i] = data->subsample_order[j];
        data->subsample_order[j] = tmp;
      }
    }
  }

  oaa* data_ptr = data.get();
  LEARNER::learner<oaa, example>* l;
  auto base = as_singleline(setup_base(options, all));
  if (probabilities || scores)
  {
    all.delete_prediction = delete_scalars;
    if (probabilities)
    {
      auto loss_function_type = all.loss->getType();
      if (loss_function_type != "logistic")
        all.trace_message << "WARNING: --probabilities should be used only with --loss_function=logistic" << endl;
      // the three boolean template parameters are: is_learn, print_all and scores
      l = &LEARNER::init_multiclass_learner(data, base, predict_or_learn<true, false, true, true>,
          predict_or_learn<false, false, true, true>, all.p, data->k, prediction_type::scalars);
      all.sd->report_multiclass_log_loss = true;
      l->set_finish_example(finish_example_scores<true>);
    }
    else
    {
      l = &LEARNER::init_multiclass_learner(data, base, predict_or_learn<true, false, true, false>,
          predict_or_learn<false, false, true, false>, all.p, data->k, prediction_type::scalars);
      l->set_finish_example(finish_example_scores<false>);
    }
  }
  else if (all.raw_prediction > 0)
    l = &LEARNER::init_multiclass_learner(data, base, predict_or_learn<true, true, false, false>,
        predict_or_learn<false, true, false, false>, all.p, data->k, prediction_type::multiclass);
  else
    l = &LEARNER::init_multiclass_learner(data, base, predict_or_learn<true, false, false, false>,
        predict_or_learn<false, false, false, false>, all.p, data->k, prediction_type::multiclass);

  if (data_ptr->num_subsample > 0)
    l->set_learn(learn_randomized);
  l->set_finish(finish);

  return make_base(*l);
}